

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O2

void soplex::updateScale<double>
               (SSVectorBase<double> *vecnnzeroes,SSVectorBase<double> *resnvec,
               SSVectorBase<double> *tmpvec,SSVectorBase<double> **psccurr,
               SSVectorBase<double> **pscprev,double qcurr,double qprev,double eprev1,double eprev2,
               double epsilon)

{
  SSVectorBase<double> *pSVar1;
  
  SSVectorBase<double>::operator-=(*pscprev,*psccurr);
  if (ABS(-eprev1 * eprev2) <= epsilon) {
    SSVectorBase<double>::clear(*pscprev);
  }
  else {
    SSVectorBase<double>::operator*=(*pscprev,-eprev1 * eprev2);
  }
  pSVar1 = SSVectorBase<double>::assignPWproduct4setup<double,double>(tmpvec,resnvec,vecnnzeroes);
  SSVectorBase<double>::operator+=(*pscprev,pSVar1);
  SSVectorBase<double>::operator*=(*pscprev,1.0 / (qcurr * qprev));
  SSVectorBase<double>::operator+=(*pscprev,*psccurr);
  pSVar1 = *psccurr;
  *psccurr = *pscprev;
  *pscprev = pSVar1;
  return;
}

Assistant:

static void updateScale(
   const SSVectorBase<R> vecnnzeroes,
   const SSVectorBase<R> resnvec,
   SSVectorBase<R>& tmpvec,
   SSVectorBase<R>*& psccurr,
   SSVectorBase<R>*& pscprev,
   R qcurr,
   R qprev,
   R eprev1,
   R eprev2,
   R epsilon)
{
   assert(psccurr != nullptr);
   assert(pscprev != nullptr);
   assert(qcurr * qprev != 0.0);

   R fac = -(eprev1 * eprev2);

   SSVectorBase<R>* pssv;

   *pscprev -= *psccurr;

   if(isZero(fac, epsilon))
      (*pscprev).clear();
   else
      *pscprev *= fac;

   *pscprev += tmpvec.assignPWproduct4setup(resnvec, vecnnzeroes);

   *pscprev *= 1.0 / (qcurr * qprev);
   *pscprev += *psccurr;

   /* swap pointers */
   pssv = psccurr;
   psccurr = pscprev;
   pscprev = pssv;
}